

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeType
          (BinaryReaderObjdumpDisassemble *this,Type type)

{
  char *fmt;
  Type local_38;
  string local_30;
  
  if (this->in_function_body == true) {
    local_38 = type;
    if ((this->super_BinaryReaderObjdumpBase).current_opcode.enum_ == SelectT) {
      Type::GetName_abi_cxx11_(&local_30,&local_38);
      LogOpcode(this,local_30._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
    else {
      fmt = Type::GetRefKindName(&local_38);
      LogOpcode(this,fmt);
    }
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeType(Type type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  if (current_opcode == Opcode::SelectT) {
    LogOpcode(type.GetName().c_str());
  } else {
    LogOpcode(type.GetRefKindName());
  }
  return Result::Ok;
}